

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O2

SiameseEncoder siamese_encoder_create(void)

{
  Encoder *this;
  
  if ((m_Initialized == '\x01') &&
     (this = (Encoder *)operator_new(0x6e8,(nothrow_t *)&std::nothrow), this != (Encoder *)0x0)) {
    siamese::Encoder::Encoder(this);
    return (SiameseEncoder)this;
  }
  return (SiameseEncoder)0x0;
}

Assistant:

SIAMESE_EXPORT SiameseEncoder siamese_encoder_create()
{
    SIAMESE_DEBUG_ASSERT(m_Initialized); // Must call siamese_init() first
    if (!m_Initialized)
        return nullptr;

    siamese::Encoder* encoder = new(std::nothrow) siamese::Encoder;

    return reinterpret_cast<SiameseEncoder>(encoder);
}